

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::set_curr_func(Plotter *this,size_t func_id)

{
  color *other;
  unsigned_long __val;
  size_t sVar1;
  Function f;
  color cStack_1a8;
  color local_178;
  Function local_148;
  
  sVar1 = func_id;
  if (this->curr_func != func_id) {
    (this->func_error)._M_string_length = 0;
    *(this->func_error)._M_dataplus._M_p = '\0';
    sVar1 = this->curr_func;
  }
  if (sVar1 < (ulong)(((long)(this->funcs).
                             super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->funcs).
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x130)) {
    reparse_expr(this,sVar1);
    sVar1 = this->curr_func;
  }
  if (sVar1 != func_id) {
    this->curr_func = func_id;
    if (func_id != 0xffffffffffffffff) {
      this->focus_on_editor = true;
    }
    this->require_update = true;
  }
  if (((long)(this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start) / 0x130 == func_id) {
    Function::Function(&local_148);
    local_148.type = 0;
    other = (this->reuse_colors).
            super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
    if ((this->reuse_colors).
        super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == other) {
      sVar1 = this->last_expr_color;
      this->last_expr_color = sVar1 + 1;
      color::from_int(&cStack_1a8,sVar1);
      color::color::operator=(&local_178,&local_148.line_color,&cStack_1a8);
    }
    else {
      color::color::operator=(&cStack_1a8,&local_148.line_color,other);
      std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::pop_front
                (&this->reuse_colors);
    }
    __val = this->next_func_name;
    this->next_func_name = __val + 1;
    std::__cxx11::to_string((string *)&cStack_1a8,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   "f",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cStack_1a8);
    std::__cxx11::string::~string((string *)&cStack_1a8);
    std::__cxx11::string::operator=((string *)&local_148,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::
    emplace_back<nivalis::Function>(&this->funcs,&local_148);
    Function::~Function(&local_148);
  }
  return;
}

Assistant:

void Plotter::set_curr_func(size_t func_id) {
    if (func_id != curr_func)
        func_error.clear();
    if (curr_func < funcs.size())
        reparse_expr(curr_func);
    if (curr_func != func_id) {
        curr_func = func_id;
        if (~curr_func) focus_on_editor = true;
        require_update = true;
    }
    if (curr_func == funcs.size()) {
        // New function
        Function f;
        f.type = Function::FUNC_TYPE_EXPLICIT;
        if (reuse_colors.empty()) {
            f.line_color =
                color::from_int(last_expr_color++);
        } else {
            f.line_color = reuse_colors.front();
            reuse_colors.pop_front();
        }
        f.name = gen_func_name(use_latex, next_func_name++);
        funcs.push_back(std::move(f));
    }
}